

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  type_conflict5 tVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  pointer pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  byte bVar13;
  uint local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  
  bVar13 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (pSVar2->sparsePricingLeave == true) {
    iVar5 = selectLeaveSparse(this);
    return iVar5;
  }
  pnVar1 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance;
  pnVar10 = pnVar1;
  puVar11 = (uint *)&result;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((pnVar10->m_backend).data._M_elems + 1);
    puVar11 = puVar11 + 1;
  }
  result.m_backend.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  result.m_backend.neg =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.neg;
  result.m_backend.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  result.m_backend.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
    result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
  }
  uVar8 = (pSVar2->thecovectors->set).thenum;
  lVar6 = 0x1c;
  local_1b4 = 0xffffffff;
  while (0 < (int)uVar8) {
    uVar8 = uVar8 - 1;
    pnVar3 = (((this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = pnVar3 + uVar8;
    pnVar10 = &local_1b0;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = pnVar3[uVar8].m_backend.exp;
    local_1b0.m_backend.neg = pnVar3[uVar8].m_backend.neg;
    local_1b0.m_backend.fpclass = pnVar3[uVar8].m_backend.fpclass;
    local_1b0.m_backend.prec_elem = pnVar3[uVar8].m_backend.prec_elem;
    pnVar10 = pnVar1;
    pnVar12 = &result_1;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + (ulong)bVar13 * -8 + 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    result_1.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    result_1.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    result_1.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    result_1.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(&local_1b0,&result_1);
    if (tVar4) {
      tVar4 = boost::multiprecision::operator<(&local_1b0,&result);
      if (tVar4) {
        pnVar10 = &local_1b0;
        pnVar12 = &result;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar13 * -2 + 1) * 4);
        }
        result.m_backend.exp = local_1b0.m_backend.exp;
        result.m_backend.neg = local_1b0.m_backend.neg;
        result.m_backend.fpclass = local_1b0.m_backend.fpclass;
        result.m_backend.prec_elem = local_1b0.m_backend.prec_elem;
        local_1b4 = uVar8;
      }
    }
  }
  return local_1b4;
}

Assistant:

int SPxDantzigPR<R>::selectLeave()
{
   assert(this->thesolver != nullptr);

   if(this->thesolver->sparsePricingLeave)
      return selectLeaveSparse();

   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   R best = -this->thetolerance;
   int  n    = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      R x = this->thesolver->fTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = i;
            best = x;
         }
      }
   }

   return n;
}